

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonetree.h
# Opt level: O3

void __thiscall
asmjit::ZoneTree<asmjit::JitAllocatorBlock>::remove<asmjit::Support::Compare<0u>>
          (ZoneTree<asmjit::JitAllocatorBlock> *this,ZoneTreeNode *node,Compare<0U> *cmp)

{
  Environment *pEVar1;
  Environment EVar2;
  Environment EVar3;
  Environment EVar4;
  ulong uVar5;
  ZoneTree<asmjit::JitAllocatorBlock> *pZVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  JitAllocatorBlock *pJVar10;
  Environment EVar11;
  ulong *puVar12;
  Environment EVar13;
  ulong uVar14;
  ZoneTreeNode *save_1;
  ulong *puVar15;
  byte *pbVar16;
  ulong uVar17;
  Environment EVar18;
  ulong *puVar19;
  ZoneTreeNode *save;
  byte *pbVar20;
  ulong *puVar21;
  undefined8 local_48;
  ZoneTree<asmjit::JitAllocatorBlock> local_40;
  ZoneTree<asmjit::JitAllocatorBlock> *local_38;
  
  local_48 = 0;
  local_38 = this;
  pJVar10 = this->_root;
  local_40._root = pJVar10;
  if (pJVar10 < (JitAllocatorBlock *)0x2) goto LAB_0011a8d4;
  pZVar6 = &local_40;
  this = *(ZoneTree<asmjit::JitAllocatorBlock> **)(node[2]._rbNodeData + 1);
  EVar18._arch = '\0';
  EVar18._subArch = '\0';
  EVar18._vendor = '\0';
  EVar18._platform = '\0';
  EVar18._abi = '\0';
  EVar18._format = '\0';
  EVar18._reserved = 0;
  EVar2._arch = '\0';
  EVar2._subArch = '\0';
  EVar2._vendor = '\0';
  EVar2._platform = '\0';
  EVar2._abi = '\0';
  EVar2._format = '\0';
  EVar2._reserved = 0;
  EVar4._arch = '\0';
  EVar4._subArch = '\0';
  EVar4._vendor = '\0';
  EVar4._platform = '\0';
  EVar4._abi = '\0';
  EVar4._format = '\0';
  EVar4._reserved = 0;
  uVar5 = 1;
  EVar13 = (Environment)&local_48;
  do {
    EVar3 = (Environment)((ulong)pJVar10 & 0xfffffffffffffffe);
    EVar11 = *(Environment *)((long)EVar3 + 0x28);
    uVar9 = (uint)((ulong)EVar11 >= this && EVar11 != (Environment)this) -
            (uint)((ulong)EVar11 < this);
    uVar14 = (ulong)(uVar9 >> 0x1f);
    if (EVar3 == (Environment)node) {
      EVar2 = EVar3;
      EVar4 = EVar18;
    }
    EVar11 = EVar13;
    if (((*(byte *)EVar3 & 1) == 0) &&
       ((pbVar20 = (byte *)(*(ulong *)((long)EVar3 + uVar14 * 8) & 0xfffffffffffffffe),
        pbVar20 == (byte *)0x0 || ((*pbVar20 & 1) == 0)))) {
      uVar7 = (ulong)(-1 < (int)uVar9);
      uVar17 = *(ulong *)((long)EVar3 + uVar7 * 8);
      EVar11 = (Environment)(uVar17 & 0xfffffffffffffffe);
      if ((EVar11 == (Environment)0x0) || ((*(byte *)EVar11 & 1) == 0)) {
        uVar7 = (ulong)(uVar5 == 0);
        uVar17 = *(ulong *)((long)EVar13 + uVar7 * 8);
        puVar21 = (ulong *)(uVar17 & 0xfffffffffffffffe);
        EVar11 = EVar13;
        if (puVar21 != (ulong *)0x0) {
          pbVar20 = (byte *)(puVar21[uVar7] & 0xfffffffffffffffe);
          if ((pbVar20 == (byte *)0x0) || ((*pbVar20 & 1) == 0)) {
            pbVar16 = (byte *)(puVar21[uVar5] & 0xfffffffffffffffe);
            if ((pbVar16 == (byte *)0x0) || ((*pbVar16 & 1) == 0)) {
              *(byte *)EVar13 = *(byte *)EVar13 & 0xfe;
              *(byte *)puVar21 = (byte)*puVar21 | 1;
              *(byte *)EVar3 = *(byte *)EVar3 | 1;
              goto LAB_0011a7ac;
            }
            puVar19 = (ulong *)((long)EVar18 +
                               (ulong)(EVar13 == *(Environment *)((long)EVar18 + 8)) * 8);
            if ((*pbVar16 & 1) != 0) goto LAB_0011a6d5;
            puVar15 = (ulong *)(*puVar19 & 0xfffffffffffffffe);
            if (pbVar20 != (byte *)0x0) goto LAB_0011a74c;
          }
          else {
            puVar19 = (ulong *)((long)EVar18 +
                               (ulong)(EVar13 == *(Environment *)((long)EVar18 + 8)) * 8);
            puVar15 = (ulong *)(*puVar19 & 0xfffffffffffffffe);
            pbVar16 = (byte *)(puVar21[uVar5] & 0xfffffffffffffffe);
            if (pbVar16 == (byte *)0x0) {
              pbVar16 = (byte *)0x0;
LAB_0011a74c:
              if ((*pbVar20 & 1) == 0) goto LAB_0011a786;
              puVar12 = puVar21 + uVar5;
              uVar17 = (ulong)pbVar16 | (ulong)((uint)uVar17 & 1);
              puVar15 = puVar21;
            }
            else {
              if ((*pbVar16 & 1) == 0) goto LAB_0011a74c;
LAB_0011a6d5:
              puVar15 = (ulong *)(puVar21[uVar5 != 0] & 0xfffffffffffffffe);
              uVar8 = (ulong)((uint)(uVar5 == 0) * 8);
              puVar21[uVar5 != 0] =
                   (ulong)((uint)puVar21[uVar5 != 0] & 1) |
                   *(ulong *)((long)puVar15 + uVar8) & 0xfffffffffffffffe;
              *(ulong *)((long)puVar15 + uVar8) =
                   (ulong)((uint)*(undefined8 *)((long)puVar15 + uVar8) & 1) | (ulong)puVar21;
              *(byte *)puVar21 = (byte)*puVar21 | 1;
              *(byte *)puVar15 = (byte)*puVar15 & 0xfe;
              uVar17 = (ulong)((uint)*(undefined8 *)((long)EVar13 + uVar8) & 1);
              *(byte **)((long)EVar13 + uVar8) = (byte *)(uVar17 + (long)puVar15);
              puVar12 = puVar15 + uVar5;
              uVar17 = *puVar12 & 0xfffffffffffffffe | uVar17;
            }
            *(ulong *)((long)EVar13 + uVar7 * 8) = uVar17;
            *puVar12 = (ulong)((uint)*puVar12 & 1) | (ulong)EVar13;
            *(byte *)EVar13 = *(byte *)EVar13 | 1;
            *(byte *)puVar15 = (byte)*puVar15 & 0xfe;
            *puVar19 = (ulong)((uint)*puVar19 & 1) | (ulong)puVar15;
          }
LAB_0011a786:
          *(byte *)EVar3 = *(byte *)EVar3 | 1;
          uVar5 = *puVar15;
          *puVar15 = uVar5 | 1;
          pbVar20 = (byte *)(uVar5 & 0xfffffffffffffffe);
          *pbVar20 = *pbVar20 & 0xfe;
          *(ulong *)puVar15[1] = *(ulong *)puVar15[1] & 0xfffffffffffffffe;
        }
      }
      else {
        *(ulong *)((long)EVar3 + uVar7 * 8) =
             (ulong)((uint)uVar17 & 1) | *(ulong *)((long)EVar11 + uVar14 * 8) & 0xfffffffffffffffe;
        *(ulong *)((long)EVar11 + uVar14 * 8) =
             (ulong)((uint)*(ulong *)((long)EVar11 + uVar14 * 8) & 1) | (ulong)EVar3;
        *(byte *)EVar3 = *(byte *)EVar3 | 1;
        *(byte *)EVar11 = *(byte *)EVar11 & 0xfe;
        pZVar6->_root = (JitAllocatorBlock *)((ulong)((uint)pZVar6->_root & 1) | (ulong)EVar11);
      }
    }
LAB_0011a7ac:
    pZVar6 = (ZoneTree<asmjit::JitAllocatorBlock> *)((long)EVar3 + uVar14 * 8);
    pJVar10 = pZVar6->_root;
    uVar5 = uVar14;
    EVar13 = EVar3;
    EVar18 = EVar11;
  } while ((JitAllocatorBlock *)0x1 < pJVar10);
  if (EVar2 == (Environment)0x0) goto LAB_0011a8d4;
  this = (ZoneTree<asmjit::JitAllocatorBlock> *)&local_48;
  if (EVar2 == (Environment)this) {
LAB_0011a8c5:
    remove<asmjit::Support::Compare<0u>>();
LAB_0011a8ca:
    remove<asmjit::Support::Compare<0u>>();
  }
  else {
    if ((Environment)this == EVar3) goto LAB_0011a8ca;
    uVar5 = (ulong)(EVar3 == *(Environment *)((long)EVar11 + 8));
    *(ulong *)((long)EVar11 + uVar5 * 8) =
         (ulong)((uint)*(ulong *)((long)EVar11 + uVar5 * 8) & 1) |
         *(ulong *)((long)EVar3 + (ulong)(*(ulong *)EVar3 < 2) * 8) & 0xfffffffffffffffe;
    if (EVar2 == EVar3) {
LAB_0011a89c:
      local_38->_root = local_40._root;
      if (local_40._root != (JitAllocatorBlock *)0x0) {
        *(byte *)((local_40._root)->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).
                 super_ZoneTreeNode._rbNodeData =
             (byte)((local_40._root)->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).
                   super_ZoneTreeNode._rbNodeData[0] & 0xfe;
      }
      return;
    }
    if (EVar2 != EVar4) {
      EVar13 = EVar4;
      if (EVar4 == (Environment)0x0) {
        EVar13 = (Environment)this;
      }
      if (EVar13 == (Environment)this) {
        uVar5 = 1;
      }
      else {
        if (EVar4 != (Environment)0x0) {
          this = (ZoneTree<asmjit::JitAllocatorBlock> *)EVar4;
        }
        uVar5 = (ulong)((ulong)*(Environment *)((long)this + 0x28) <
                       (ulong)*(Environment *)(node[2]._rbNodeData + 1));
      }
      this = *(ZoneTree<asmjit::JitAllocatorBlock> **)((long)EVar13 + uVar5 * 8);
      while (EVar4 = (Environment)((ulong)this & 0xfffffffffffffffe), EVar2 != EVar4) {
        if (EVar4 == (Environment)0x0) {
          remove<asmjit::Support::Compare<0u>>();
          goto LAB_0011a8c5;
        }
        uVar5 = (ulong)((ulong)*(Environment *)((long)EVar4 + 0x28) <
                       (ulong)*(Environment *)(node[2]._rbNodeData + 1));
        EVar13 = EVar4;
        this = *(ZoneTree<asmjit::JitAllocatorBlock> **)((long)EVar4 + uVar5 * 8);
      }
      *(ulong *)((long)EVar13 + uVar5 * 8) = (ulong)((uint)this & 1) | (ulong)EVar3;
      *(ulong *)EVar3 = *(ulong *)EVar2;
      *(Environment *)((long)EVar3 + 8) = *(Environment *)((long)EVar2 + 8);
      goto LAB_0011a89c;
    }
  }
  remove<asmjit::Support::Compare<0u>>();
LAB_0011a8d4:
  remove<asmjit::Support::Compare<0u>>();
  Target::Target((Target *)this);
  *this = (ZoneTree<asmjit::JitAllocatorBlock>)&PTR__JitRuntime_00154750;
  JitAllocator::JitAllocator((JitAllocator *)((long)this + 0x10),(CreateParams *)node);
  pEVar1 = (Environment *)((long)this + 8);
  pEVar1->_arch = '\x02';
  pEVar1->_subArch = '\0';
  pEVar1->_vendor = '\0';
  pEVar1->_platform = '\x03';
  pEVar1->_abi = '\x02';
  pEVar1->_format = '\x01';
  pEVar1->_reserved = 0;
  return;
}

Assistant:

inline ZoneTreeNode() noexcept
    : _rbNodeData { 0, 0 } {}